

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void deqp::gls::FboUtil::logFramebufferConfig(Framebuffer *cfg,TestLog *log)

{
  TestLog *pTVar1;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  char *pcVar5;
  pointer ppVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  LogSection local_270;
  allocator<char> local_229;
  undefined1 local_228 [8];
  string attPointName;
  _Self local_200;
  const_iterator it_2;
  string local_1f0;
  LogSection local_1d0;
  allocator<char> local_189;
  undefined1 local_188 [8];
  string attDesc;
  ScopedLogSection local_148;
  ScopedLogSection subsection_1;
  string num_1;
  _Self local_118;
  const_iterator it_1;
  ScopedLogSection local_f0;
  ScopedLogSection subsection;
  string num;
  _Self local_c0;
  const_iterator it;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  LogSection local_58;
  TestLog *local_18;
  TestLog *log_local;
  Framebuffer *cfg_local;
  
  local_18 = log;
  log_local = (TestLog *)cfg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Framebuffer",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"Framebuffer configuration",
             (allocator<char> *)((long)&it._M_node + 7));
  tcu::LogSection::LogSection(&local_58,&local_78,&local_b0);
  tcu::TestLog::operator<<(log,&local_58);
  tcu::LogSection::~LogSection(&local_58);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>_>
       ::begin((map<unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>_>
                *)(log_local + 0xc));
  while( true ) {
    num.field_2._8_8_ =
         std::
         map<unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>_>
         ::end((map<unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>_>
                *)(log_local + 0xc));
    bVar2 = std::operator!=(&local_c0,(_Self *)((long)&num.field_2 + 8));
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>
             ::operator->(&local_c0);
    de::toString<unsigned_int>((string *)&subsection,&ppVar3->first);
    pTVar1 = local_18;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                   "Renderbuffer ",(string *)&subsection);
    tcu::ScopedLogSection::ScopedLogSection(&local_f0,pTVar1,(string *)&subsection,(string *)&it_1);
    std::__cxx11::string::~string((string *)&it_1);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>
             ::operator->(&local_c0);
    logRenderbuffer(ppVar3->second,local_18);
    tcu::ScopedLogSection::~ScopedLogSection(&local_f0);
    std::__cxx11::string::~string((string *)&subsection);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>
    ::operator++(&local_c0);
  }
  local_118._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>_>
       ::begin((map<unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>_>
                *)(log_local + 6));
  while( true ) {
    num_1.field_2._8_8_ =
         std::
         map<unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>_>
         ::end((map<unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>_>
                *)(log_local + 6));
    bVar2 = std::operator!=(&local_118,(_Self *)((long)&num_1.field_2 + 8));
    if (!bVar2) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>
             ::operator->(&local_118);
    de::toString<unsigned_int>((string *)&subsection_1,&ppVar4->first);
    pTVar1 = local_18;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&attDesc.field_2 + 8),"Texture ",(string *)&subsection_1);
    tcu::ScopedLogSection::ScopedLogSection
              (&local_148,pTVar1,(string *)&subsection_1,(string *)((long)&attDesc.field_2 + 8));
    std::__cxx11::string::~string((string *)(attDesc.field_2._M_local_buf + 8));
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>
             ::operator->(&local_118);
    logTexture(ppVar4->second,local_18);
    tcu::ScopedLogSection::~ScopedLogSection(&local_148);
    std::__cxx11::string::~string((string *)&subsection_1);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>
    ::operator++(&local_118);
  }
  bVar2 = std::
          map<unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
          ::empty((map<unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
                   *)log_local);
  pcVar5 = "Framebuffer attachments";
  if (bVar2) {
    pcVar5 = "Framebuffer has no attachments";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_188,pcVar5,&local_189);
  std::allocator<char>::~allocator(&local_189);
  pTVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Attachments",(allocator<char> *)((long)&it_2._M_node + 7));
  tcu::LogSection::LogSection(&local_1d0,&local_1f0,(string *)local_188);
  tcu::TestLog::operator<<(pTVar1,&local_1d0);
  tcu::LogSection::~LogSection(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it_2._M_node + 7));
  local_200._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
       ::begin((map<unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
                *)log_local);
  while( true ) {
    attPointName.field_2._8_8_ =
         std::
         map<unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
         ::end((map<unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
                *)log_local);
    bVar2 = std::operator!=(&local_200,(_Self *)((long)&attPointName.field_2 + 8));
    if (!bVar2) break;
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>
             ::operator->(&local_200);
    pcVar5 = glu::getFramebufferAttachmentName(ppVar6->first);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_228,pcVar5,&local_229);
    std::allocator<char>::~allocator(&local_229);
    pTVar1 = local_18;
    std::operator+(&local_290,"Attachment point ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
    tcu::LogSection::LogSection(&local_270,(string *)local_228,&local_290);
    tcu::TestLog::operator<<(pTVar1,&local_270);
    tcu::LogSection::~LogSection(&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>
             ::operator->(&local_200);
    logAttachment(ppVar6->second,local_18);
    tcu::TestLog::operator<<(local_18,(EndSectionToken *)&tcu::TestLog::EndSection);
    std::__cxx11::string::~string((string *)local_228);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>
    ::operator++(&local_200,0);
  }
  tcu::TestLog::operator<<(local_18,(EndSectionToken *)&tcu::TestLog::EndSection);
  tcu::TestLog::operator<<(local_18,(EndSectionToken *)&tcu::TestLog::EndSection);
  std::__cxx11::string::~string((string *)local_188);
  return;
}

Assistant:

void logFramebufferConfig (const Framebuffer& cfg, TestLog& log)
{
	log << TestLog::Section("Framebuffer", "Framebuffer configuration");

	for (RboMap::const_iterator it = cfg.rbos.begin(); it != cfg.rbos.end(); ++it)
	{
		const string				num			= toString(it->first);
		const tcu::ScopedLogSection	subsection	(log, num, "Renderbuffer " + num);

		logRenderbuffer(*it->second, log);
	}

	for (TextureMap::const_iterator it = cfg.textures.begin();
		it != cfg.textures.end(); ++it)
	{
		const string				num			= toString(it->first);
		const tcu::ScopedLogSection	subsection	(log, num, "Texture " + num);

		logTexture(*it->second, log);
	}

	const string attDesc = cfg.attachments.empty()
		? "Framebuffer has no attachments"
		: "Framebuffer attachments";
	log << TestLog::Section("Attachments", attDesc);
	for (AttachmentMap::const_iterator it = cfg.attachments.begin();
		 it != cfg.attachments.end(); it++)
	{
		const string attPointName = getFramebufferAttachmentName(it->first);
		log << TestLog::Section(attPointName, "Attachment point " + attPointName);
		logAttachment(*it->second, log);
		log << TestLog::EndSection;
	}
	log << TestLog::EndSection; // Attachments

	log << TestLog::EndSection; // Framebuffer
}